

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_A_ExtChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *actor;
  bool bVar1;
  FState *local_68;
  FState *local_58;
  bool local_3f;
  bool local_3c;
  bool local_3b;
  bool nightmarefast;
  bool playactive;
  bool domissile;
  bool domelee;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xaf9,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xaf9,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  actor = (AActor *)(param->field_0).field_1.a;
  local_3f = true;
  if (actor != (AActor *)0x0) {
    local_3f = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
  }
  if (local_3f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xaf9,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafa,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafa,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafb,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafb,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
    local_3b = true;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                    ,0xafc,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    local_3b = param[3].field_0.i != 0;
  }
  if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
    local_3c = false;
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                    ,0xafd,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    local_3c = param[4].field_0.i != 0;
  }
  if (param[1].field_0.i == 0) {
    local_58 = (FState *)0x0;
  }
  else {
    local_58 = actor->MeleeState;
  }
  if (param[2].field_0.i == 0) {
    local_68 = (FState *)0x0;
  }
  else {
    local_68 = actor->MissileState;
  }
  A_DoChase(stack,actor,false,local_58,local_68,local_3b,local_3c,false,0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_ExtChase)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL		(domelee);
	PARAM_BOOL		(domissile);
	PARAM_BOOL_OPT	(playactive)	{ playactive = true; }
	PARAM_BOOL_OPT	(nightmarefast)	{ nightmarefast = false; }

	// Now that A_Chase can handle state label parameters, this function has become rather useless...
	A_DoChase(stack, self, false,
		domelee ? self->MeleeState : NULL, domissile ? self->MissileState : NULL,
		playactive, nightmarefast, false, 0);
	return 0;
}